

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::read_bad_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  InputSource *this_00;
  int iVar4;
  qpdf_offset_t qVar5;
  longlong lVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  string f1_str;
  string f2_str;
  string line;
  char *local_160;
  ulong local_158;
  char local_150;
  undefined7 uStack_14f;
  char *local_140;
  ulong local_138;
  char local_130;
  undefined7 uStack_12f;
  int *local_120;
  longlong *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  QPDFExc local_b0;
  
  this_00 = (((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118 = f1;
  qVar5 = InputSource::getLastOffset(this_00);
  bVar8 = false;
  (*this_00->_vptr_InputSource[5])(this_00,qVar5,0);
  InputSource::readLine_abi_cxx11_
            (&local_d0,
             (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x1e);
  for (_Var7._M_p = local_d0._M_dataplus._M_p;
      (bVar1 = *_Var7._M_p, bVar1 - 9 < 5 || (bVar1 == 0x20)); _Var7._M_p = _Var7._M_p + 1) {
    bVar8 = true;
  }
  if (9 < (byte)(bVar1 - 0x30)) {
    bVar8 = false;
    goto LAB_0022f0a8;
  }
  local_160 = &local_150;
  local_158 = 0;
  local_150 = '\0';
  local_120 = f2;
  for (; bVar1 = *_Var7._M_p, (byte)(bVar1 - 0x30) < 10; _Var7._M_p = _Var7._M_p + 1) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_160,local_158,0,'\x01');
  }
  if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) {
    bVar1 = ((byte *)_Var7._M_p)[1];
    for (; (bVar2 = *_Var7._M_p, bVar2 - 9 < 5 || (bVar2 == 0x20)); _Var7._M_p = _Var7._M_p + 1) {
    }
    if ((byte)(bVar2 - 0x30) < 10) {
      local_140 = &local_130;
      local_138 = 0;
      local_130 = '\0';
      for (; bVar2 = *_Var7._M_p, (byte)(bVar2 - 0x30) < 10; _Var7._M_p = _Var7._M_p + 1) {
        std::__cxx11::string::_M_replace_aux((ulong)&local_140,local_138,0,'\x01');
      }
      if ((bVar2 - 9 < 5) || (bVar2 == 0x20)) {
        bVar2 = ((byte *)_Var7._M_p)[1];
        for (; (bVar3 = *_Var7._M_p, bVar3 - 9 < 5 || (bVar3 == 0x20)); _Var7._M_p = _Var7._M_p + 1)
        {
        }
        if ((bVar3 != 0x66) && (bVar3 != 0x6e)) goto LAB_0022f06e;
        *type = bVar3;
        if (((bVar8 || ((byte)(0x100003e00 >> (bVar1 & 0x3f)) & bVar1 < 0x21) != 0) ||
            ((byte)(0x100003e00 >> (bVar2 & 0x3f)) & bVar2 < 0x21) != 0) ||
            (local_138 != 5 || local_158 != 10)) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"xref table","");
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"accepting invalid xref table entry","");
          damagedPDF(&local_b0,this,&local_f0,&local_110);
          warn(this,&local_b0);
          QPDFExc::~QPDFExc(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        lVar6 = QUtil::string_to_ll(local_160);
        *local_118 = lVar6;
        iVar4 = QUtil::string_to_int(local_140);
        *local_120 = iVar4;
        bVar8 = true;
      }
      else {
LAB_0022f06e:
        bVar8 = false;
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
      }
    }
    else {
      bVar8 = false;
    }
  }
  else {
    bVar8 = false;
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
  }
LAB_0022f0a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool
QPDF::read_bad_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    // Reposition after initial read attempt and reread.
    m->file->seek(m->file->getLastOffset(), SEEK_SET);
    auto line = m->file->readLine(30);

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.data();

    // Skip zero or more spaces. There aren't supposed to be any.
    bool invalid = false;
    while (util::is_space(*p)) {
        ++p;
        QTC::TC("qpdf", "QPDF ignore first space in xref entry");
        invalid = true;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f1_str;
    while (util::is_digit(*p)) {
        f1_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore first extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f2_str;
    while (util::is_digit(*p)) {
        f2_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore second extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    if ((*p == 'f') || (*p == 'n')) {
        type = *p;
    } else {
        return false;
    }
    if ((f1_str.length() != 10) || (f2_str.length() != 5)) {
        QTC::TC("qpdf", "QPDF ignore length error xref entry");
        invalid = true;
    }

    if (invalid) {
        warn(damagedPDF("xref table", "accepting invalid xref table entry"));
    }

    f1 = QUtil::string_to_ll(f1_str.c_str());
    f2 = QUtil::string_to_int(f2_str.c_str());

    return true;
}